

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

mz_bool mz_zip_add_mem_to_archive_file_in_place
                  (char *pZip_filename,char *pArchive_name,void *pBuf,size_t buf_size,void *pComment
                  ,mz_uint16 comment_size,mz_uint level_and_flags)

{
  mz_bool mVar1;
  int iVar2;
  long in_RCX;
  long in_RDX;
  char *in_RSI;
  char *in_RDI;
  long in_R8;
  short in_R9W;
  uint in_stack_00000008;
  int ignoredStatus;
  stat64 file_stat;
  mz_zip_archive zip_archive;
  mz_bool created_new_archive;
  mz_bool status;
  mz_uint64 in_stack_00000ec8;
  char *in_stack_00000ed0;
  mz_zip_archive *in_stack_00000ed8;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  char *in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 uVar3;
  mz_uint32 in_stack_fffffffffffffebc;
  char *in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  mz_zip_archive *in_stack_fffffffffffffed8;
  undefined1 local_a0 [62];
  mz_uint16 in_stack_ffffffffffffff9e;
  void *in_stack_ffffffffffffffa0;
  size_t in_stack_ffffffffffffffa8;
  void *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar4;
  mz_bool local_38;
  mz_bool local_4;
  
  iVar4 = 0;
  memset(local_a0,0,0x60);
  if ((int)in_stack_00000008 < 0) {
    in_stack_00000008 = 6;
  }
  if ((((in_RDI == (char *)0x0) || (in_RSI == (char *)0x0)) || ((in_RCX != 0 && (in_RDX == 0)))) ||
     (((in_R9W != 0 && (in_R8 == 0)) || (10 < (in_stack_00000008 & 0xf))))) {
    local_4 = 0;
  }
  else {
    mVar1 = (anonymous_namespace)::miniz::mz_zip_writer_validate_archive_name(in_RSI);
    if (mVar1 == 0) {
      local_4 = 0;
    }
    else {
      iVar2 = stat64(in_RDI,(stat64 *)&stack0xfffffffffffffed0);
      if (iVar2 == 0) {
        mVar1 = mz_zip_reader_init_file
                          ((mz_zip_archive *)
                           CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                           in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
        if (mVar1 == 0) {
          return 0;
        }
        mVar1 = mz_zip_writer_init_from_reader
                          ((mz_zip_archive *)
                           CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                           in_stack_fffffffffffffeb0);
        if (mVar1 == 0) {
          mz_zip_reader_end((mz_zip_archive *)
                            CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
          return 0;
        }
      }
      else {
        mVar1 = mz_zip_writer_init_file(in_stack_00000ed8,in_stack_00000ed0,in_stack_00000ec8);
        if (mVar1 == 0) {
          return 0;
        }
        iVar4 = 1;
      }
      uVar3 = 0;
      local_38 = mz_zip_writer_add_mem_ex
                           ((mz_zip_archive *)CONCAT44(iVar4,in_stack_ffffffffffffffc0),
                            in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                            in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                            in_stack_ffffffffffffff9e,(mz_uint)file_stat.st_mtim.tv_sec,
                            file_stat.st_mtim.tv_nsec,(mz_uint32)file_stat.st_ctim.tv_sec);
      mVar1 = mz_zip_writer_finalize_archive(in_stack_fffffffffffffed8);
      if (mVar1 == 0) {
        local_38 = 0;
      }
      mVar1 = mz_zip_writer_end((mz_zip_archive *)CONCAT44(in_stack_fffffffffffffebc,uVar3));
      if (mVar1 == 0) {
        local_38 = 0;
      }
      if ((local_38 == 0) && (iVar4 != 0)) {
        remove(in_RDI);
      }
      local_4 = local_38;
    }
  }
  return local_4;
}

Assistant:

mz_bool mz_zip_add_mem_to_archive_file_in_place(
    const char *pZip_filename, const char *pArchive_name, const void *pBuf,
    size_t buf_size, const void *pComment, mz_uint16 comment_size,
    mz_uint level_and_flags) {
  mz_bool status, created_new_archive = MZ_FALSE;
  mz_zip_archive zip_archive;
  struct MZ_FILE_STAT_STRUCT file_stat;
  MZ_CLEAR_OBJ(zip_archive);
  if ((int)level_and_flags < 0)
    level_and_flags = MZ_DEFAULT_LEVEL;
  if ((!pZip_filename) || (!pArchive_name) || ((buf_size) && (!pBuf)) ||
      ((comment_size) && (!pComment)) ||
      ((level_and_flags & 0xF) > MZ_UBER_COMPRESSION))
    return MZ_FALSE;
  if (!mz_zip_writer_validate_archive_name(pArchive_name))
    return MZ_FALSE;
  if (MZ_FILE_STAT(pZip_filename, &file_stat) != 0) {
    // Create a new archive.
    if (!mz_zip_writer_init_file(&zip_archive, pZip_filename, 0))
      return MZ_FALSE;
    created_new_archive = MZ_TRUE;
  } else {
    // Append to an existing archive.
    if (!mz_zip_reader_init_file(&zip_archive, pZip_filename,
                                 level_and_flags |
                                     MZ_ZIP_FLAG_DO_NOT_SORT_CENTRAL_DIRECTORY))
      return MZ_FALSE;
    if (!mz_zip_writer_init_from_reader(&zip_archive, pZip_filename)) {
      mz_zip_reader_end(&zip_archive);
      return MZ_FALSE;
    }
  }
  status =
      mz_zip_writer_add_mem_ex(&zip_archive, pArchive_name, pBuf, buf_size,
                               pComment, comment_size, level_and_flags, 0, 0);
  // Always finalize, even if adding failed for some reason, so we have a valid
  // central directory. (This may not always succeed, but we can try.)
  if (!mz_zip_writer_finalize_archive(&zip_archive))
    status = MZ_FALSE;
  if (!mz_zip_writer_end(&zip_archive))
    status = MZ_FALSE;
  if ((!status) && (created_new_archive)) {
    // It's a new archive and something went wrong, so just delete it.
    int ignoredStatus = MZ_DELETE_FILE(pZip_filename);
    (void)ignoredStatus;
  }
  return status;
}